

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O2

bool extractLine(string *line,string *text,int width,bool hyphenate,uint *offset,char surrogate)

{
  int iVar1;
  char cVar2;
  char cVar3;
  ulong uVar4;
  pointer pcVar5;
  wchar_t ucs;
  int iVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined3 in_register_00000089;
  ulong uVar10;
  size_type sVar11;
  int iVar12;
  size_type bytes;
  undefined4 local_78;
  undefined4 local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_74 = CONCAT31(in_register_00000089,surrogate);
  uVar7 = (ulong)*offset;
  uVar4 = text->_M_string_length;
  if (uVar4 <= uVar7) goto LAB_00111614;
  local_78 = (undefined4)CONCAT71(in_register_00000009,hyphenate);
  uVar9 = 0;
  sVar11 = uVar7;
  iVar1 = 0;
  bytes = uVar7;
  do {
    do {
      iVar12 = iVar1;
      uVar10 = sVar11;
      sVar11 = bytes;
      ucs = utf8_next_char(text,&bytes);
      if (ucs == L' ') {
        uVar9 = sVar11 & 0xffffffff;
      }
      else if ((ucs == L'\n') || (ucs == L'\0')) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
        std::__cxx11::string::operator=((string *)line,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        sVar11 = bytes & 0xffffffff;
        goto LAB_00111606;
      }
      iVar6 = mk_wcwidth(ucs);
      iVar1 = iVar6 + iVar12;
    } while (iVar1 <= width);
    pcVar5 = (text->_M_dataplus)._M_p;
    cVar2 = pcVar5[uVar10];
    cVar3 = pcVar5[sVar11];
    if ((cVar2 != ' ') && (cVar3 == ' ')) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
      std::__cxx11::string::operator=((string *)line,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      sVar11 = (size_type)((int)sVar11 + 1);
      goto LAB_00111606;
    }
    iVar8 = (int)uVar9;
    if (((cVar2 == ' ') && (cVar3 != ' ')) && (iVar8 != 0)) {
      this = &local_70;
      std::__cxx11::string::substr((ulong)this,(ulong)text);
      std::__cxx11::string::operator=((string *)line,(string *)this);
      goto LAB_00111504;
    }
  } while ((cVar2 == ' ') || (cVar3 == ' '));
  if (iVar8 == 0) {
    if (sVar11 == *offset && width < iVar6) {
      std::__cxx11::string::operator=((string *)line,(char)local_74);
      sVar11 = bytes & 0xffffffff;
    }
    else if ((char)local_78 == '\0') {
LAB_001115e7:
      std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
      std::__cxx11::string::operator=((string *)line,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else if (iVar12 < width) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)text);
      std::operator+(&local_70,&local_50,'-');
      std::__cxx11::string::operator=((string *)line,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      this = &local_50;
LAB_00111504:
      std::__cxx11::string::~string((string *)this);
    }
    else {
      if (uVar10 == *offset) goto LAB_001115e7;
      std::__cxx11::string::substr((ulong)&local_50,(ulong)text);
      std::operator+(&local_70,&local_50,'-');
      std::__cxx11::string::operator=((string *)line,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      sVar11 = uVar10 & 0xffffffff;
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
    std::__cxx11::string::operator=((string *)line,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    sVar11 = (size_type)(iVar8 + 1);
  }
LAB_00111606:
  *offset = (uint)sVar11;
LAB_00111614:
  return uVar7 < uVar4;
}

Assistant:

bool extractLine (
  std::string& line,
  const std::string& text,
  int width,
  bool hyphenate,
  unsigned int& offset,
  char surrogate)
{
  // Terminate processing.
  // Note: bytes vs bytes.
  if (offset >= text.length ())
    return false;

  std::string::size_type last_last_bytes = offset;
  std::string::size_type last_bytes = offset;
  std::string::size_type bytes = offset;
  unsigned int last_ws = 0;
  int character;
  int char_width = 0;
  int line_width = 0;
  while (1)
  {
    last_last_bytes = last_bytes;
    last_bytes = bytes;
    character = utf8_next_char (text, bytes);

    if (character == 0 ||
        character == '\n')
    {
      line = text.substr (offset, last_bytes - offset);
      offset = bytes;
      break;
    }
    else if (character == ' ')
      last_ws = last_bytes;

    char_width = mk_wcwidth (character);
    if (line_width + char_width > width)
    {
      int last_last_character = text[last_last_bytes];
      int last_character = text[last_bytes];

      // [case 1] one| two --> last_last != 32, last == 32, ws == 0
      if (last_last_character != ' ' &&
          last_character      == ' ')
      {
        line = text.substr (offset, last_bytes - offset);
        offset = last_bytes + 1;
        break;
      }

      // [case 2] one |two --> last_last == 32, last != 32, ws != 0
      else if (last_last_character == ' ' &&
               last_character      != ' ' &&
               last_ws             != 0)
      {
        line = text.substr (offset, last_bytes - offset - 1);
        offset = last_bytes;
        break;
      }

      else if (last_last_character != ' ' &&
               last_character      != ' ')
      {
        // [case 3] one t|wo --> last_last != 32, last != 32, ws != 0
        if (last_ws != 0)
        {
          line = text.substr (offset, last_ws - offset);
          offset = last_ws + 1;
          break;
        }
        // [case 4] on|e two --> last_last != 32, last != 32, ws == 0
        else
        {
          if (char_width > width && last_bytes == offset)
          {
            // the first character is already too wide,
            // no other way to split the line but to replace the character
            // with a surrogate
            line = surrogate;
            offset = bytes;
          }
          else
          {
            if (hyphenate)
            {
              if (line_width + 1 <= width)
              {
                // if the last good part + hyphen is short enough,
                // i.e. the just read character is wider than one column
                line = text.substr (offset, last_bytes - offset) + '-';
                offset = last_bytes;
              }
              else if (last_last_bytes - offset > 0)
              {
                // sacrifice last character from the last good part,
                // but only if there is at least one character left
                line = text.substr (offset, last_last_bytes - offset) + '-';
                offset = last_last_bytes;
              }
              else
              {
                // no other way to split the line but to omit the hyphen
                line = text.substr (offset, last_bytes - offset);
                offset = last_bytes;
              }
            }
            else
            {
              // just use the last good part
              line = text.substr (offset, last_bytes - offset);
              offset = last_bytes;
            }
          }
        }

        break;
      }
    }

    line_width += char_width;
  }

  return true;
}